

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O1

DeepScanLineOutputFile * __thiscall
Imf_3_4::MultiPartOutputFile::getOutputPart<Imf_3_4::DeepScanLineOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  int iVar3;
  mapped_type *ppGVar4;
  DeepScanLineOutputFile *this_00;
  ostream *poVar5;
  ArgExc *this_01;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  stringstream _iex_throw_s;
  int local_1ac;
  pair<int,_Imf_3_4::GenericOutputFile_*> local_1a8;
  ostream local_198 [376];
  
  local_1ac = partNumber;
  if ((-1 < partNumber) &&
     (__mutex = (pthread_mutex_t *)this->_data,
     partNumber <
     (int)((ulong)(*(long *)((long)__mutex + 0x90) - *(long *)((long)__mutex + 0x88)) >> 3) *
     -0x49249249)) {
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 == 0) {
      pDVar2 = this->_data;
      p_Var1 = &(pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0;
          p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < local_1ac]) {
        if (local_1ac <= (int)p_Var7[1]._M_color) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, local_1ac < (int)p_Var6[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        this_00 = (DeepScanLineOutputFile *)operator_new(0x10);
        DeepScanLineOutputFile::DeepScanLineOutputFile
                  (this_00,(pDVar2->parts).
                           super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1ac]);
        local_1a8.first = local_1ac;
        local_1a8.second = (GenericOutputFile *)this_00;
        std::
        _Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
        ::_M_emplace_unique<std::pair<int,Imf_3_4::GenericOutputFile*>>
                  ((_Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
                    *)&this->_data->_outputFiles,&local_1a8);
      }
      else {
        ppGVar4 = std::
                  map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
                  ::operator[](&pDVar2->_outputFiles,&local_1ac);
        this_00 = (DeepScanLineOutputFile *)*ppGVar4;
      }
      pthread_mutex_unlock(__mutex);
      return this_00;
    }
    std::__throw_system_error(iVar3);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"MultiPartOutputFile::getOutputPart called with invalid part number  ",0x44);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1ac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," on file with ",0xe);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," parts",6);
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_01,(stringstream *)&local_1a8);
  __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartOutputFile::getOutputPart (int partNumber)
{

    if (partNumber < 0 || partNumber >= int (_data->_headers.size ()))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartOutputFile::getOutputPart called with invalid part number  "
                << partNumber << " on file with " << _data->_headers.size ()
                << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data);
#endif
    if (_data->_outputFiles.find (partNumber) == _data->_outputFiles.end ())
    {
        T* file = new T (_data->parts[partNumber]);
        _data->_outputFiles.insert (
            std::make_pair (partNumber, (GenericOutputFile*) file));
        return file;
    }
    else
        return (T*) _data->_outputFiles[partNumber];
}